

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::GridSample_x86_fma::forward
          (GridSample_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int *piVar1;
  const_reference src;
  const_reference dst;
  reference offset_value;
  Mat *in_RCX;
  Mat *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar2;
  Mat *unaff_retaddr;
  int in_stack_00000054;
  Mat *in_stack_00000058;
  Mat *in_stack_00000060;
  Mat *in_stack_00000068;
  Option *in_stack_00000078;
  Mat *in_stack_00000080;
  Mat *in_stack_00000088;
  Mat *in_stack_00000090;
  Mat grid_p1;
  Mat offset_value_blob;
  int outd;
  int outh;
  int outw;
  size_t elemsize;
  int dims;
  int channels;
  int elempack;
  Mat *top_blob;
  Mat *grid;
  Mat *bottom_blob;
  Option *in_stack_000001f0;
  Mat *in_stack_000001f8;
  Mat *in_stack_00000200;
  Mat *in_stack_00000208;
  Option *in_stack_00000350;
  Mat *in_stack_00000358;
  Mat *in_stack_00000360;
  Mat *in_stack_00000368;
  size_t in_stack_fffffffffffffce8;
  Allocator *in_stack_fffffffffffffcf0;
  Mat *pMVar3;
  size_t in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd04;
  Option *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  undefined2 in_stack_fffffffffffffd14;
  undefined1 in_stack_fffffffffffffd16;
  undefined1 in_stack_fffffffffffffd17;
  Mat *in_stack_fffffffffffffd18;
  undefined6 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd26;
  undefined1 in_stack_fffffffffffffd27;
  int local_2c8;
  int local_2c4;
  int local_2c0;
  int in_stack_fffffffffffffd60;
  Mat *in_stack_fffffffffffffd68;
  undefined6 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd76;
  undefined1 in_stack_fffffffffffffd77;
  bool local_279;
  int local_278;
  int local_274;
  Mat local_230;
  Mat local_1e8;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  int in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  Mat *dst_00;
  undefined4 in_stack_fffffffffffffe78;
  int iVar4;
  int iVar5;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  int iVar6;
  Mat *offset_value_00;
  int in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  const_reference in_stack_fffffffffffffee0;
  undefined8 in_stack_ffffffffffffff08;
  Mat *in_stack_ffffffffffffff10;
  Mat *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff68;
  int permute_fusion;
  Mat *in_stack_ffffffffffffff70;
  Mat *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  Mat *in_stack_ffffffffffffff88;
  int iVar7;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  const_reference in_stack_ffffffffffffff98;
  Mat *in_stack_ffffffffffffffa0;
  Mat *in_stack_ffffffffffffffa8;
  reference in_stack_ffffffffffffffe8;
  Mat *in_stack_fffffffffffffff0;
  Mat *in_stack_fffffffffffffff8;
  
  iVar7 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  permute_fusion = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  src = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  dst = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  offset_value = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                           ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_RDX,0);
  iVar6 = src->elempack;
  iVar5 = src->c;
  iVar4 = src->dims;
  dst_00 = (Mat *)src->elemsize;
  pMVar3 = &local_1e8;
  local_1e8.data = (void *)0x0;
  local_1e8.refcount = (int *)0x0;
  local_1e8.elemsize = 0;
  local_1e8.elempack = 0;
  local_1e8.allocator = (Allocator *)0x0;
  local_1e8.dims = 0;
  local_1e8.w = 0;
  local_1e8.h = 0;
  local_1e8.d = 0;
  local_1e8.c = 0;
  local_1e8.cstep = 0;
  offset_value_00 = &local_230;
  local_230.data = (void *)0x0;
  local_230.refcount = (int *)0x0;
  local_230.elemsize = 0;
  local_230.elempack = 0;
  local_230.allocator = (Allocator *)0x0;
  local_230.dims = 0;
  local_230.w = 0;
  local_230.h = 0;
  local_230.d = 0;
  local_230.c = 0;
  local_230.cstep = 0;
  if (dst->elempack == 1) {
    if (&local_230 != dst) {
      if (dst->refcount != (int *)0x0) {
        piVar1 = dst->refcount;
        in_stack_fffffffffffffedc = 1;
        LOCK();
        in_stack_fffffffffffffed8 = *piVar1;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      local_230.data = dst->data;
      local_230.refcount = dst->refcount;
      local_230.elemsize = dst->elemsize;
      local_230.elempack = dst->elempack;
      local_230.allocator = dst->allocator;
      local_230.dims = dst->dims;
      local_230.w = dst->w;
      local_230.h = dst->h;
      local_230.d = dst->d;
      local_230.c = dst->c;
      local_230.cstep = dst->cstep;
      in_stack_ffffffffffffff98 = &local_230;
    }
    local_1e8.cstep = 0;
    local_1e8.c = 0;
    local_1e8.d = 0;
    local_1e8.h = 0;
    local_1e8.w = 0;
    local_1e8.dims = 0;
    local_1e8.allocator = (Allocator *)0x0;
    local_1e8.elempack = 0;
    local_1e8.elemsize = 0;
    local_1e8.refcount = (int *)0x0;
    local_1e8.data = (void *)0x0;
    local_279 = (bool)in_stack_fffffffffffffd77;
    local_2c8 = in_stack_fffffffffffffe64;
    local_2c4 = in_stack_fffffffffffffe68;
    local_2c0 = in_stack_fffffffffffffe6c;
    in_stack_fffffffffffffee0 = dst;
  }
  else {
    convert_packing((Mat *)CONCAT17(in_stack_fffffffffffffd27,
                                    CONCAT16(in_stack_fffffffffffffd26,in_stack_fffffffffffffd20)),
                    in_stack_fffffffffffffd18,
                    CONCAT13(in_stack_fffffffffffffd17,
                             CONCAT12(in_stack_fffffffffffffd16,in_stack_fffffffffffffd14)),
                    in_stack_fffffffffffffd08);
    local_279 = (bool)in_stack_fffffffffffffd77;
    local_2c8 = in_stack_fffffffffffffe64;
    local_2c4 = in_stack_fffffffffffffe68;
    local_2c0 = in_stack_fffffffffffffe6c;
  }
  if (iVar4 == 3) {
    if (*(int *)(in_RDI + 0xdc) == 0) {
      local_274 = local_230.h;
    }
    else {
      local_274 = local_230.w;
    }
    if (*(int *)(in_RDI + 0xdc) == 0) {
      local_278 = local_230.c;
    }
    else {
      local_278 = local_230.h;
    }
    Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffd17,
                                CONCAT16(in_stack_fffffffffffffd16,
                                         CONCAT24(in_stack_fffffffffffffd14,
                                                  in_stack_fffffffffffffd10))),
                (int)((ulong)in_stack_fffffffffffffd08 >> 0x20),(int)in_stack_fffffffffffffd08,
                in_stack_fffffffffffffd04,in_stack_fffffffffffffcf8,
                (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                (Allocator *)
                CONCAT17(local_279,CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)));
    local_279 = true;
    if (offset_value->data != (void *)0x0) {
      local_279 = offset_value->cstep * (long)offset_value->c == 0;
    }
    if (local_279 != false) {
      iVar6 = -100;
      goto LAB_01f4d571;
    }
    if (*(int *)(in_RDI + 0xd0) == 1) {
      Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffd17,
                                  CONCAT16(in_stack_fffffffffffffd16,
                                           CONCAT24(in_stack_fffffffffffffd14,
                                                    in_stack_fffffffffffffd10))),
                  (int)((ulong)in_stack_fffffffffffffd08 >> 0x20),(int)in_stack_fffffffffffffd08,
                  CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                  (int)(in_stack_fffffffffffffcf8 >> 0x20),in_stack_fffffffffffffcf0);
      in_stack_fffffffffffffd68 = &local_1e8;
      in_stack_fffffffffffffd76 =
           local_1e8.data == (void *)0x0 || local_1e8.cstep * (long)local_1e8.c == 0;
      if ((bool)in_stack_fffffffffffffd76) {
        iVar6 = -100;
        goto LAB_01f4d571;
      }
      in_stack_ffffffffffffff20 = in_stack_fffffffffffffd68;
      if (*(int *)(in_RDI + 0xd4) == 1) {
        if (*(int *)(in_RDI + 0xd8) == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    ((Mat *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,permute_fusion);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    ((Mat *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,permute_fusion);
        }
      }
      else if (*(int *)(in_RDI + 0xd4) == 2) {
        if (*(int *)(in_RDI + 0xd8) == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    ((Mat *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,permute_fusion);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    ((Mat *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,permute_fusion);
        }
      }
      else {
        if (*(int *)(in_RDI + 0xd4) != 3) {
          fprintf(_stderr,"gridsample padding_mode error\n");
          fprintf(_stderr,"\n");
          iVar6 = -100;
          goto LAB_01f4d571;
        }
        if (*(int *)(in_RDI + 0xd8) == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    ((Mat *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,permute_fusion);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    ((Mat *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,permute_fusion);
        }
      }
    }
    if (*(int *)(in_RDI + 0xd0) == 2) {
      Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffd17,
                                  CONCAT16(in_stack_fffffffffffffd16,
                                           CONCAT24(in_stack_fffffffffffffd14,
                                                    in_stack_fffffffffffffd10))),
                  (int)((ulong)in_stack_fffffffffffffd08 >> 0x20),(int)in_stack_fffffffffffffd08,
                  in_stack_fffffffffffffd04,in_stack_fffffffffffffcf8,
                  (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                  (Allocator *)
                  CONCAT17(local_279,CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)))
      ;
      if (local_1e8.data == (void *)0x0 || local_1e8.cstep * (long)local_1e8.c == 0) {
        iVar6 = -100;
        goto LAB_01f4d571;
      }
      if (*(int *)(in_RDI + 0xd4) == 1) {
        if (*(int *)(in_RDI + 0xd8) == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (in_stack_ffffffffffffff20,&local_1e8,in_stack_ffffffffffffff10,iVar7);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (in_stack_ffffffffffffff20,&local_1e8,in_stack_ffffffffffffff10,iVar7);
        }
      }
      else if (*(int *)(in_RDI + 0xd4) == 2) {
        if (*(int *)(in_RDI + 0xd8) == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (in_stack_ffffffffffffff20,&local_1e8,in_stack_ffffffffffffff10,iVar7);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (in_stack_ffffffffffffff20,&local_1e8,in_stack_ffffffffffffff10,iVar7);
        }
      }
      else {
        if (*(int *)(in_RDI + 0xd4) != 3) {
          fprintf(_stderr,"gridsample padding_mode error\n");
          fprintf(_stderr,"\n");
          iVar6 = -100;
          goto LAB_01f4d571;
        }
        if (*(int *)(in_RDI + 0xd8) == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (in_stack_ffffffffffffff20,&local_1e8,in_stack_ffffffffffffff10,iVar7);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (in_stack_ffffffffffffff20,&local_1e8,in_stack_ffffffffffffff10,iVar7);
        }
      }
    }
    local_2c4 = local_278;
    local_2c0 = local_274;
    if (*(int *)(in_RDI + 0xd0) == 3) {
      Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffd17,
                                  CONCAT16(in_stack_fffffffffffffd16,
                                           CONCAT24(in_stack_fffffffffffffd14,
                                                    in_stack_fffffffffffffd10))),
                  (int)((ulong)in_stack_fffffffffffffd08 >> 0x20),(int)in_stack_fffffffffffffd08,
                  CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                  (int)(in_stack_fffffffffffffcf8 >> 0x20),in_stack_fffffffffffffcf0);
      if (local_1e8.data == (void *)0x0 || local_1e8.cstep * (long)local_1e8.c == 0) {
        iVar6 = -100;
        goto LAB_01f4d571;
      }
      iVar7 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
      if (*(int *)(in_RDI + 0xd4) == 1) {
        if (*(int *)(in_RDI + 0xd8) == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     (Mat *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),iVar7);
          local_2c4 = local_278;
          local_2c0 = local_274;
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     (Mat *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),iVar7);
          local_2c4 = local_278;
          local_2c0 = local_274;
        }
      }
      else if (*(int *)(in_RDI + 0xd4) == 2) {
        if (*(int *)(in_RDI + 0xd8) == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     (Mat *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),iVar7);
          local_2c4 = local_278;
          local_2c0 = local_274;
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     (Mat *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),iVar7);
          local_2c4 = local_278;
          local_2c0 = local_274;
        }
      }
      else {
        if (*(int *)(in_RDI + 0xd4) != 3) {
          fprintf(_stderr,"gridsample padding_mode error\n");
          fprintf(_stderr,"\n");
          iVar6 = -100;
          goto LAB_01f4d571;
        }
        if (*(int *)(in_RDI + 0xd8) == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     (Mat *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),iVar7);
          local_2c4 = local_278;
          local_2c0 = local_274;
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     (Mat *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),iVar7);
          local_2c4 = local_278;
          local_2c0 = local_274;
        }
      }
    }
  }
  if (iVar4 == 4) {
    if (*(int *)(in_RDI + 0xdc) == 0) {
      local_2c0 = local_230.h;
    }
    else {
      local_2c0 = local_230.w;
    }
    if (*(int *)(in_RDI + 0xdc) == 0) {
      local_2c4 = local_230.d;
    }
    else {
      local_2c4 = local_230.h;
    }
    if (*(int *)(in_RDI + 0xdc) == 0) {
      local_2c8 = local_230.c;
    }
    else {
      local_2c8 = local_230.d;
    }
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                (int)(in_stack_fffffffffffffcf8 >> 0x20),(int)in_stack_fffffffffffffcf8,
                (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20),(int)in_stack_fffffffffffffcf0,
                in_stack_fffffffffffffce8,in_stack_fffffffffffffd60,
                (Allocator *)in_stack_fffffffffffffd68);
    bVar2 = true;
    if (offset_value->data != (void *)0x0) {
      bVar2 = offset_value->cstep * (long)offset_value->c == 0;
      in_stack_ffffffffffffffe8 = offset_value;
    }
    if (bVar2) {
      iVar6 = -100;
      goto LAB_01f4d571;
    }
    if (*(int *)(in_RDI + 0xd0) == 1) {
      Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffd17,
                                  CONCAT16(in_stack_fffffffffffffd16,
                                           CONCAT24(in_stack_fffffffffffffd14,
                                                    in_stack_fffffffffffffd10))),
                  (int)((ulong)in_stack_fffffffffffffd08 >> 0x20),(int)in_stack_fffffffffffffd08,
                  in_stack_fffffffffffffd04,in_stack_fffffffffffffcf8,
                  (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                  (Allocator *)
                  CONCAT17(local_279,CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)))
      ;
      if (local_1e8.data != (void *)0x0) {
        in_stack_fffffffffffffff0 = &local_1e8;
      }
      if (local_1e8.data == (void *)0x0 || local_1e8.cstep * (long)local_1e8.c == 0) {
        iVar6 = -100;
        goto LAB_01f4d571;
      }
      if (*(int *)(in_RDI + 0xd4) == 1) {
        if (*(int *)(in_RDI + 0xd8) == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000054);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000054);
        }
      }
      else if (*(int *)(in_RDI + 0xd4) == 2) {
        if (*(int *)(in_RDI + 0xd8) == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000054);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000054);
        }
      }
      else {
        if (*(int *)(in_RDI + 0xd4) != 3) {
          fprintf(_stderr,"gridsample padding_mode error\n");
          fprintf(_stderr,"\n");
          iVar6 = -100;
          goto LAB_01f4d571;
        }
        if (*(int *)(in_RDI + 0xd8) == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000054);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000054);
        }
      }
    }
    if (*(int *)(in_RDI + 0xd0) == 2) {
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                  (int)(in_stack_fffffffffffffcf8 >> 0x20),(int)in_stack_fffffffffffffcf8,
                  (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20),(int)in_stack_fffffffffffffcf0,
                  in_stack_fffffffffffffce8,in_stack_fffffffffffffd60,
                  (Allocator *)in_stack_fffffffffffffd68);
      if (local_1e8.data != (void *)0x0) {
        in_stack_fffffffffffffff8 = &local_1e8;
      }
      if (local_1e8.data == (void *)0x0 || local_1e8.cstep * (long)local_1e8.c == 0) {
        iVar6 = -100;
        goto LAB_01f4d571;
      }
      if (*(int *)(in_RDI + 0xd4) == 1) {
        if (*(int *)(in_RDI + 0xd8) == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff94);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff94);
        }
      }
      else if (*(int *)(in_RDI + 0xd4) == 2) {
        if (*(int *)(in_RDI + 0xd8) == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff94);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff94);
        }
      }
      else {
        if (*(int *)(in_RDI + 0xd4) != 3) {
          fprintf(_stderr,"gridsample padding_mode error\n");
          fprintf(_stderr,"\n");
          iVar6 = -100;
          goto LAB_01f4d571;
        }
        if (*(int *)(in_RDI + 0xd8) == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff94);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff94);
        }
      }
    }
    if (*(int *)(in_RDI + 0xd0) == 3) {
      fprintf(_stderr,"unsupported bicubic when dims == 4");
      fprintf(_stderr,"\n");
      iVar6 = -100;
      goto LAB_01f4d571;
    }
  }
  if (iVar6 == 8) {
    if (iVar4 == 3) {
      if (*(int *)(in_RDI + 0xd0) == 1) {
        gridsample_2d_bilinear_apply_interpolation_p8
                  ((Mat *)grid_p1._40_8_,(Mat *)grid_p1.allocator,(Mat *)grid_p1._24_8_,
                   (Option *)grid_p1.elemsize);
      }
      else if (*(int *)(in_RDI + 0xd0) == 2) {
        gridsample_nearest_apply_interpolation_p8
                  (in_stack_fffffffffffffee0,
                   (Mat *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                   offset_value_00,(Option *)pMVar3);
      }
      else if (*(int *)(in_RDI + 0xd0) == 3) {
        gridsample_2d_bicubic_apply_interpolation_p8
                  (in_stack_00000208,in_stack_00000200,in_stack_000001f8,in_stack_000001f0);
      }
    }
    else if (iVar4 == 4) {
      if (*(int *)(in_RDI + 0xd0) == 1) {
        gridsample_3d_bilinear_apply_interpolation_p8
                  (in_stack_00000368,in_stack_00000360,in_stack_00000358,in_stack_00000350);
      }
      else if (*(int *)(in_RDI + 0xd0) == 2) {
        gridsample_nearest_apply_interpolation_p8
                  (in_stack_fffffffffffffee0,
                   (Mat *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                   offset_value_00,(Option *)pMVar3);
      }
    }
  }
  if (iVar6 == 4) {
    if (iVar4 == 3) {
      if (*(int *)(in_RDI + 0xd0) == 1) {
        gridsample_2d_bilinear_apply_interpolation_p4
                  ((Mat *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88,
                   (Mat *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (Option *)in_stack_ffffffffffffff78);
      }
      else if (*(int *)(in_RDI + 0xd0) == 2) {
        gridsample_nearest_apply_interpolation_p4(src,dst,offset_value,(Option *)CONCAT44(4,iVar5));
      }
      else if (*(int *)(in_RDI + 0xd0) == 3) {
        gridsample_2d_bicubic_apply_interpolation_p4
                  (unaff_retaddr,in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,
                   (Option *)in_stack_ffffffffffffffe8);
      }
    }
    else if (iVar4 == 4) {
      if (*(int *)(in_RDI + 0xd0) == 1) {
        gridsample_3d_bilinear_apply_interpolation_p4
                  (in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
      }
      else if (*(int *)(in_RDI + 0xd0) == 2) {
        gridsample_nearest_apply_interpolation_p4(src,dst,offset_value,(Option *)CONCAT44(4,iVar5));
      }
    }
  }
  if (iVar6 == 1) {
    if (iVar4 == 3) {
      if (*(int *)(in_RDI + 0xd0) == 1) {
        gridsample_2d_bilinear_apply_interpolation_p1(in_RDX,in_RCX,src,(Option *)dst);
      }
      else if (*(int *)(in_RDI + 0xd0) == 2) {
        gridsample_nearest_apply_interpolation_p1
                  ((Mat *)CONCAT44(3,in_stack_fffffffffffffe78),dst_00,
                   (Mat *)CONCAT44(local_2c0,local_2c4),
                   (Option *)CONCAT44(local_2c8,in_stack_fffffffffffffe60));
      }
      else if (*(int *)(in_RDI + 0xd0) == 3) {
        gridsample_2d_bicubic_apply_interpolation_p1
                  ((Mat *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                   offset_value_00,pMVar3,
                   (Option *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      }
    }
    else if (iVar4 == 4) {
      if (*(int *)(in_RDI + 0xd0) == 1) {
        gridsample_3d_bilinear_apply_interpolation_p1
                  ((Mat *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                   offset_value_00,pMVar3,
                   (Option *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      }
      else if (*(int *)(in_RDI + 0xd0) == 2) {
        gridsample_nearest_apply_interpolation_p1
                  ((Mat *)CONCAT44(4,in_stack_fffffffffffffe78),dst_00,
                   (Mat *)CONCAT44(local_2c0,local_2c4),
                   (Option *)CONCAT44(local_2c8,in_stack_fffffffffffffe60));
      }
    }
  }
  iVar6 = 0;
LAB_01f4d571:
  pMVar3 = &local_230;
  if (local_230.refcount != (int *)0x0) {
    LOCK();
    iVar5 = *local_230.refcount;
    *local_230.refcount = *local_230.refcount + -1;
    UNLOCK();
    if (iVar5 == 1) {
      if (local_230.allocator == (Allocator *)0x0) {
        if (local_230.data != (void *)0x0) {
          free(local_230.data);
        }
      }
      else {
        (*(local_230.allocator)->_vptr_Allocator[3])(local_230.allocator,local_230.data);
      }
    }
  }
  pMVar3->data = (void *)0x0;
  pMVar3->elemsize = 0;
  pMVar3->elempack = 0;
  pMVar3->dims = 0;
  pMVar3->w = 0;
  pMVar3->h = 0;
  pMVar3->d = 0;
  pMVar3->c = 0;
  pMVar3->cstep = 0;
  pMVar3->refcount = (int *)0x0;
  pMVar3 = &local_1e8;
  if (local_1e8.refcount != (int *)0x0) {
    LOCK();
    iVar5 = *local_1e8.refcount;
    *local_1e8.refcount = *local_1e8.refcount + -1;
    UNLOCK();
    if (iVar5 == 1) {
      if (local_1e8.allocator == (Allocator *)0x0) {
        if (local_1e8.data != (void *)0x0) {
          free(local_1e8.data);
        }
      }
      else {
        (*(local_1e8.allocator)->_vptr_Allocator[3])(local_1e8.allocator,local_1e8.data);
      }
    }
  }
  pMVar3->data = (void *)0x0;
  pMVar3->elemsize = 0;
  pMVar3->elempack = 0;
  pMVar3->dims = 0;
  pMVar3->w = 0;
  pMVar3->h = 0;
  pMVar3->d = 0;
  pMVar3->c = 0;
  pMVar3->cstep = 0;
  pMVar3->refcount = (int *)0x0;
  return iVar6;
}

Assistant:

int GridSample_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& grid = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];
    int elempack = bottom_blob.elempack;

    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw, outh, outd;
    Mat offset_value_blob;

    Mat grid_p1;
    if (grid.elempack != 1)
    {
        convert_packing(grid, grid_p1, 1, opt);
    }
    else
    {
        grid_p1 = grid;
    }

    if (dims == 3)
    {
        outw = permute_fusion == 0 ? grid_p1.h : grid_p1.w;
        outh = permute_fusion == 0 ? grid_p1.c : grid_p1.h;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == GridSample::Interpolation_BILINEAR)
        {
            offset_value_blob.create(outw, outh, elemsize * 6, 6, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_NEAREST)
        {
            offset_value_blob.create(outw, outh, 1, elemsize, 1, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_BICUBIC)
        {
            offset_value_blob.create(outw, outh, elemsize * 18, 18, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }
    }

    if (dims == 4)
    {
        outw = permute_fusion == 0 ? grid_p1.h : grid_p1.w;
        outh = permute_fusion == 0 ? grid_p1.d : grid_p1.h;
        outd = permute_fusion == 0 ? grid_p1.c : grid_p1.d;

        top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == GridSample::Interpolation_BILINEAR)
        {
            offset_value_blob.create(outw, outh, outd, elemsize * 11, 11, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_NEAREST)
        {
            offset_value_blob.create(outw, outh, outd, 1, elemsize, 1, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == 3)
        {
            NCNN_LOGE("unsupported bicubic when dims == 4");
            return -100;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

#endif // __AVX__
    if (elempack == 4)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

#endif // __SSE2__

    if (elempack == 1)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

    return 0;
}